

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall
SolidGlassMaterial::sample
          (SolidGlassMaterial *this,Vector3f *col,Hit *hit,Ray *ray,Vector3f *coe,Runtime *rt,
          bool emit)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  Vector3f *this_00;
  Vector3f *v0;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  Vector3f *in_R8;
  undefined8 *in_R9;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte in_stack_00000008;
  Vector3f np;
  float r_1;
  float u_1;
  Ray ray2;
  float s_1;
  float alpha_1;
  float beta_1;
  float si2_1;
  float si_1;
  float s;
  float alpha;
  float beta;
  float r;
  float u;
  float si2;
  float si;
  float co;
  mt19937 *g;
  Ray *in_stack_fffffffffffffdd8;
  Ray *in_stack_fffffffffffffde0;
  Vector3f *in_stack_fffffffffffffde8;
  mt19937 *in_stack_fffffffffffffdf0;
  Ray *in_stack_fffffffffffffdf8;
  Vector3f *in_stack_fffffffffffffe00;
  Vector3f *in_stack_fffffffffffffe08;
  Vector2f *in_stack_fffffffffffffef0;
  Texture *in_stack_fffffffffffffef8;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_4c;
  undefined8 local_48;
  byte local_39;
  Vector3f *local_30;
  long local_28;
  long local_20;
  
  local_39 = in_stack_00000008 & 1;
  local_48 = *in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  ::operator-(in_stack_fffffffffffffde8);
  fVar3 = Vector3f::dot((Vector3f *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  if (fVar3 <= 0.0) {
    local_4c = -fVar3;
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_4c),ZEXT416((uint)fVar3),
                             SUB6416(ZEXT464(0x3f800000),0));
    local_e0 = auVar1._0_4_;
    local_e4 = 0.0;
    pfVar2 = std::max<float>(&local_e0,&local_e4);
    local_dc = sqrtf(*pfVar2);
    fVar3 = local_dc / *(float *)(in_RDI + 0xd8);
    if (fVar3 <= 1.0) {
      fVar4 = asinf(local_dc);
      fVar3 = asinf(fVar3);
      Ray::Ray(in_stack_fffffffffffffde0);
      Ray::pos(in_stack_fffffffffffffdf8,(float)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
      Vector3f::operator=(&in_stack_fffffffffffffde0->o,&in_stack_fffffffffffffdd8->o);
      if ((local_dc != 0.0) || (NAN(local_dc))) {
        in_stack_fffffffffffffe08 = (Vector3f *)(local_28 + 0xc);
        Vector3f::normalized(&in_stack_fffffffffffffdf8->o);
        sinf(fVar4 - fVar3);
        ::operator*(&in_stack_fffffffffffffdf8->o,(float)((ulong)in_stack_fffffffffffffdf0 >> 0x20))
        ;
        ::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        Vector3f::normalized(&in_stack_fffffffffffffdf8->o);
        Vector3f::operator=(&in_stack_fffffffffffffde0->o,&in_stack_fffffffffffffdd8->o);
      }
      else {
        Vector3f::operator=(&in_stack_fffffffffffffde0->o,&in_stack_fffffffffffffdd8->o);
      }
      fVar3 = Vector3f::dot((Vector3f *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      fVar3 = 1.0 - fVar3;
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar3),
                               ZEXT416((uint)((1.0 - *(float *)(in_RDI + 0xdc)) * fVar3 * fVar3 *
                                              fVar3 * fVar3)),ZEXT416(*(uint *)(in_RDI + 0xdc)));
      auVar6._0_8_ = (double)auVar1._0_4_;
      auVar6._8_8_ = auVar1._8_8_;
      auVar1 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar6,ZEXT816(0x3fd0000000000000));
      fVar3 = randf(in_stack_fffffffffffffdf0);
      if ((float)auVar1._0_8_ < fVar3) {
        Ray::operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        Vector2f::Vector2f((Vector2f *)in_stack_fffffffffffffde0,
                           (Vector2f *)in_stack_fffffffffffffdd8);
        Texture::get(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        ::operator*(in_stack_fffffffffffffe08,local_30);
        Vector3f::operator=(&in_stack_fffffffffffffde0->o,&in_stack_fffffffffffffdd8->o);
        return true;
      }
    }
    fVar3 = (float)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  }
  else {
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)-fVar3),
                             SUB6416(ZEXT464(0x3f800000),0));
    local_60 = auVar1._0_4_;
    local_64 = 0.0;
    local_4c = fVar3;
    pfVar2 = std::max<float>(&local_60,&local_64);
    local_5c = sqrtf(*pfVar2);
    local_68 = local_5c * *(float *)(in_RDI + 0xd8);
    if (local_68 <= 1.0) {
      local_6c = 1.0 - local_4c;
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_6c),
                               ZEXT416((uint)((1.0 - *(float *)(in_RDI + 0xdc)) * local_6c *
                                              local_6c * local_6c * local_6c)),
                               ZEXT416(*(uint *)(in_RDI + 0xdc)));
      auVar5._0_8_ = (double)auVar1._0_4_;
      auVar5._8_8_ = auVar1._8_8_;
      auVar1 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar5,ZEXT816(0x3fd0000000000000));
      local_70 = (float)auVar1._0_8_;
      fVar3 = randf(in_stack_fffffffffffffdf0);
      fVar4 = (float)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
      if (local_70 < fVar3) {
        local_74 = asinf(local_5c);
        local_78 = asinf(local_68);
        local_7c = local_74 - local_78;
        Ray::pos(in_stack_fffffffffffffdf8,fVar4);
        Vector3f::operator=(&in_stack_fffffffffffffde0->o,&in_stack_fffffffffffffdd8->o);
        if ((local_5c != 0.0) || (NAN(local_5c))) {
          Vector3f::normalized(&in_stack_fffffffffffffdf8->o);
          sinf(local_7c);
          ::operator*(&in_stack_fffffffffffffdf8->o,fVar4);
          ::operator-(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
          Vector3f::normalized(&in_stack_fffffffffffffdf8->o);
          Vector3f::operator=(&in_stack_fffffffffffffde0->o,&in_stack_fffffffffffffdd8->o);
        }
        Vector2f::Vector2f((Vector2f *)in_stack_fffffffffffffde0,
                           (Vector2f *)in_stack_fffffffffffffdd8);
        Texture::get(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        ::operator*(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        Vector3f::operator=(&in_stack_fffffffffffffde0->o,&in_stack_fffffffffffffdd8->o);
        return true;
      }
    }
    fVar3 = (float)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  }
  this_00 = (Vector3f *)(in_RDI + 8);
  Vector2f::Vector2f((Vector2f *)this_00,(Vector2f *)in_stack_fffffffffffffdd8);
  Texture::get(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  ::operator*(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  Vector3f::operator=(this_00,&in_stack_fffffffffffffdd8->o);
  ::operator*(&in_stack_fffffffffffffdf8->o,fVar3);
  v0 = (Vector3f *)(local_20 + 0xc);
  ::operator-(local_30);
  Vector3f::dot(v0,local_30);
  fVar3 = (float)((ulong)v0 >> 0x20);
  ::operator*(&in_stack_fffffffffffffdf8->o,fVar3);
  ::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  Vector3f::normalize(this_00);
  Ray::pos(in_stack_fffffffffffffdf8,fVar3);
  Vector3f::operator=(this_00,&in_stack_fffffffffffffdd8->o);
  Vector3f::operator=(this_00,&in_stack_fffffffffffffdd8->o);
  return true;
}

Assistant:

bool sample(Vector3f& col, const Hit& hit, Ray& ray, Vector3f& coe, Runtime& rt, bool emit) const override {
		using std::cerr;
		RNG_TYPE& g = *rt.g;
		float co = Vector3f::dot(-ray.d, hit.norm);
//		std::cerr << co << "sample!"<<" "<<hit.norm[0]<<"w"<<hit.norm[1]<<"w"<<hit.norm[2]<<" "<<ray.d[0]<<"w"<<ray.d[1]<<"w"<<ray.d[2]<<"\n";
		if (co > 0) { //air->glass
			float si = sqrtf(std::max(1 - co * co, float(0)));
			float si2 = si * refractCoef;
//			cerr << "check A " << si2 << "\n";
			if (si2 <= 1) { //total reflection otherwise
				float u = 1 - co;
				float r = r0 + (1 - r0) * u * u * u * u * u;
				r = 0.25 + 0.5 * r;
//				cerr << "prob=" << r << "  " << r0 << "\n";
				if (randf(g) > r) //refract
				{
					//get refraction ray as a linear combination
					float beta = asinf(si), alpha = asinf(si2);
					//					std::cerr << "refract A " << si << "->" << si2 << "  "<<beta<<"->"<<alpha<<"\n";
					float s = beta - alpha;
					ray.o = ray.pos(hit.t);
					//					ray.d = -((-ray.d) * s + hit.norm).normalized();
					if (si != 0) //unchanged otherwise
						ray.d = (ray.d - hit.norm.normalized() * (sinf(s) / si)).normalized();
					coe = coe * refractColor.get(hit.pos);
					return 1;
				}
			}
		}
		else { //glass->air
			co = -co;
			float si = sqrtf(std::max(1 - co * co,float(0)));
			float si2 = si / refractCoef;
//			cerr << "check B " << si2 << " "<<ray.d[0]<<"w"<<ray.d[1]<<"w"<<ray.d[2]<<" "<<hit.t<<"\n";
//			std::cerr << si << "w" << si2 << "  "<< 1 - co * co <<"?\n";
			if (si2 <= 1) { //total reflection otherwise
					//get refraction ray as a linear combination
				float beta = asinf(si), alpha = asinf(si2);
				//					std::cerr << "refract B " << si << "->" << si2 << "  " << beta << "->" << alpha << "\n";
				float s = beta - alpha;
				Ray ray2;
				ray2.o = ray.pos(hit.t);
				if (si != 0) //unchanged otherwise
					ray2.d = (ray.d + hit.norm.normalized() * (sinf(s) / si)).normalized();
				else ray2.d = ray.d;
				float u = 1 - Vector3f::dot(hit.norm, ray2.d);
//				std::cerr << u << "?\n";
				float r = r0 + (1 - r0) * u * u * u * u * u;
				r = 0.25 + 0.5 * r;
//				cerr << "prob=" << r << "  "<<r0<<"\n";
				if (randf(g) > r) //refract
				{
//					std::cerr << "cool refract!\n";
					ray = ray2;
					coe = coe * refractColor.get(hit.pos);
					return 1;
				}
			}
		}
//		std::cerr << "reflect :(\n";
		//reflect
		coe = coe * reflectColor.get(hit.pos);
		Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
		ray.o = ray.pos(hit.t); ray.d = np; return 1;
		/*
		float co = Vector3f::dot(-ray.d, hit.norm);
		bool in = co > 0; if (!in) co = -co;
		float c = in ? (1 / refractCoef) : refractCoef;
		float cos2t = 1 - c * c * (1 - co * co);
		if (cos2t < 0) //internal
		{
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np; return 1;
		}
		Vector3f rp;
		float c = 1 - (in ? co : Vector3f::dot(rp, hit.norm));
		float p = r0 + (1 - r0) * c * c * c * c * c;
		if (randf(g) < p) { //reflect
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np; return 1;
		}
		else { //refract
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np; return 1;
		}
		bool into = n.dot(nl) > 0;                // Ray from outside going in? 
		double nc = 1, nt = 1.5, nnt = into ? nc / nt : nt / nc, ddn = r.d.dot(nl), cos2t;
		if ((cos2t = 1 - nnt * nnt * (1 - ddn * ddn)) < 0)    // Total internal reflection 
			return obj.e + f.mult(radiance(reflRay, depth, Xi));
		Vec tdir = (r.d * nnt - n * ((into ? 1 : -1) * (ddn * nnt + sqrt(cos2t)))).norm();
		double a = nt - nc, b = nt + nc, R0 = a * a / (b * b), c = 1 - (into ? -ddn : tdir.dot(n));
		double Re = R0 + (1 - R0) * c * c * c * c * c, Tr = 1 - Re, P = .25 + .5 * Re, RP = Re / P, TP = Tr / (1 - P);
		return obj.e + f.mult(depth > 2 ? (erand48(Xi) < P ?   // Russian roulette 
			radiance(reflRay, depth, Xi) * RP : radiance(Ray(x, tdir), depth, Xi) * TP) :
			radiance(reflRay, depth, Xi) * Re + radiance(Ray(x, tdir), depth, Xi) * Tr);*/
	}